

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

int IoCommandReadDsd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  
  Extra_UtilGetoptReset();
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"ch");
  } while (iVar1 == 99);
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    pNtk = Io_ReadDsd(argv[globalUtilOptind]);
    if (pNtk != (Abc_Ntk_t *)0x0) {
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
      Abc_FrameClearVerifStatus(pAbc);
      return 0;
    }
  }
  else {
    fwrite("usage: read_dsd [-h] <formula>\n",0x1f,1,(FILE *)pAbc->Err);
    fwrite("\t          parses a formula representing DSD of a function\n",0x3b,1,(FILE *)pAbc->Err)
    ;
    fwrite("\t-h      : prints the command summary\n",0x26,1,(FILE *)pAbc->Err);
    fwrite("\tformula : the formula representing disjoint-support decomposition (DSD)\n",0x49,1,
           (FILE *)pAbc->Err);
    fwrite("\t          Example of a formula: !(a*(b+CA(!d,e*f,c))*79B3(g,h,i,k))\n",0x45,1,
           (FILE *)pAbc->Err);
    fwrite("\t          where \'!\' is an INV, \'*\' is an AND, \'+\' is an XOR, \n",0x3f,1,
           (FILE *)pAbc->Err);
    fwrite("\t          CA and 79B3 are hexadecimal representations of truth tables\n",0x47,1,
           (FILE *)pAbc->Err);
    fwrite("\t          (in this case CA=11001010 is truth table of MUX(Data0,Data1,Ctrl))\n",0x4e,1
           ,(FILE *)pAbc->Err);
    fwrite("\t          The lower chars (a,b,c,etc) are reserved for elementary variables.\n",0x4e,1
           ,(FILE *)pAbc->Err);
    fwrite("\t          The upper chars (A,B,C,etc) are reserved for hexadecimal digits.\n",0x4c,1,
           (FILE *)pAbc->Err);
    fwrite("\t          No spaces are allowed in formulas. In parentheses, LSB goes first.\n",0x4e,1
           ,(FILE *)pAbc->Err);
  }
  return 1;
}

Assistant:

int IoCommandReadDsd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk;
    char * pString;
    int fCheck;
    int c;
    extern Abc_Ntk_t * Io_ReadDsd( char * pFormula );

    fCheck = 1;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
            case 'c':
                fCheck ^= 1;
                break;
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
        goto usage;
    // get the input file name
    pString = argv[globalUtilOptind];
    // read the file using the corresponding file reader
    pNtk = Io_ReadDsd( pString );
    if ( pNtk == NULL )
        return 1;
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtk );
    Abc_FrameClearVerifStatus( pAbc );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_dsd [-h] <formula>\n" );
    fprintf( pAbc->Err, "\t          parses a formula representing DSD of a function\n" );
    fprintf( pAbc->Err, "\t-h      : prints the command summary\n" );
    fprintf( pAbc->Err, "\tformula : the formula representing disjoint-support decomposition (DSD)\n" );
    fprintf( pAbc->Err, "\t          Example of a formula: !(a*(b+CA(!d,e*f,c))*79B3(g,h,i,k))\n" );
    fprintf( pAbc->Err, "\t          where \'!\' is an INV, \'*\' is an AND, \'+\' is an XOR, \n" );
    fprintf( pAbc->Err, "\t          CA and 79B3 are hexadecimal representations of truth tables\n" );
    fprintf( pAbc->Err, "\t          (in this case CA=11001010 is truth table of MUX(Data0,Data1,Ctrl))\n" );
    fprintf( pAbc->Err, "\t          The lower chars (a,b,c,etc) are reserved for elementary variables.\n" );
    fprintf( pAbc->Err, "\t          The upper chars (A,B,C,etc) are reserved for hexadecimal digits.\n" );
    fprintf( pAbc->Err, "\t          No spaces are allowed in formulas. In parentheses, LSB goes first.\n" );
    return 1;
}